

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O0

int __thiscall
trieste::detail::InsideStar<2UL>::clone
          (InsideStar<2UL> *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  shared_ptr<trieste::detail::InsideStar<2UL>_> local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  InsideStar<2UL> *this_local;
  
  local_18._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__fn;
  this_local = this;
  std::make_shared<trieste::detail::InsideStar<2ul>,trieste::detail::InsideStar<2ul>const&>
            ((InsideStar<2UL> *)&local_28);
  std::shared_ptr<trieste::detail::PatternDef>::shared_ptr<trieste::detail::InsideStar<2ul>,void>
            ((shared_ptr<trieste::detail::PatternDef> *)this,&local_28);
  std::shared_ptr<trieste::detail::InsideStar<2UL>_>::~shared_ptr(&local_28);
  return (int)this;
}

Assistant:

PatternPtr clone() const& override
      {
        return std::make_shared<InsideStar>(*this);
      }